

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

void __thiscall
kj::anon_unknown_36::HttpEntityBodyReader::HttpEntityBodyReader
          (HttpEntityBodyReader *this,HttpInputStreamImpl *inner)

{
  char (*params) [65];
  StringPtr *in_R8;
  long lVar1;
  Fault local_b0;
  Array<char> local_a8;
  DebugComparison<kj::Maybe<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&>_&>_&,_const_kj::None_&>
  _kjCondition;
  String argValues [2];
  StringPtr local_38;
  char *local_28;
  undefined8 local_20;
  
  (this->super_AsyncInputStream)._vptr_AsyncInputStream = (_func_int **)&PTR_read_0066cbc0;
  (this->weakInner).ptr = (HttpInputStreamImpl *)0x0;
  this->finished = false;
  _kjCondition.left =
       &(inner->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl>).
        currentWrapper;
  _kjCondition.result =
       (inner->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl>).
       currentWrapper.ptr == (Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&> *)0x0;
  _kjCondition.right = (None *)&kj::none;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (_kjCondition.result) {
    (inner->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl>).
    currentWrapper.ptr = &this->weakInner;
    (this->weakInner).ptr = inner;
    return;
  }
  local_b0.exception = (Exception *)0x0;
  local_28 = "(can\'t stringify)";
  local_20 = 0x12;
  local_38.content.ptr = "(can\'t stringify)";
  local_38.content.size_ = 0x12;
  kj::_::concat<kj::StringPtr,kj::StringPtr&,kj::StringPtr>
            ((String *)&local_a8,(_ *)&local_28,&_kjCondition.op,&local_38,in_R8);
  argValues[0].content.ptr = local_a8.ptr;
  argValues[0].content.size_ = local_a8.size_;
  argValues[0].content.disposer = local_a8.disposer;
  local_a8.ptr = (char *)0x0;
  local_a8.size_ = 0;
  Array<char>::~Array(&local_a8);
  str<char_const(&)[65]>
            (argValues + 1,(kj *)"bug in KJ HTTP: only one HTTP stream wrapper can exist at a time",
             params);
  local_a8.ptr = (char *)argValues;
  local_a8.size_ = 2;
  kj::_::Debug::Fault::init
            (&local_b0,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
            );
  lVar1 = 0x18;
  do {
    Array<char>::~Array((Array<char> *)((long)&argValues[0].content.ptr + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  kj::_::Debug::Fault::fatal(&local_b0);
}

Assistant:

HttpEntityBodyReader(HttpInputStreamImpl& inner) {
    inner.setCurrentWrapper(weakInner);
  }